

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::ListFields
          (GeneratedMessageReflection *this,Message *message,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  ReflectionSchema *this_00;
  pointer *pppFVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  pointer ppFVar7;
  FieldDescriptor *pFVar8;
  FieldDescriptor *pFVar9;
  bool bVar10;
  uint32 uVar11;
  int iVar12;
  LogMessage *pLVar13;
  ulong uVar14;
  long lVar15;
  iterator __position;
  pointer ppFVar16;
  long lVar17;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i;
  Message *message_00;
  pointer ppFVar18;
  FieldDescriptor *field;
  FieldDescriptor *local_d0;
  LogFinisher local_c1;
  long local_c0;
  ReflectionSchema *local_b8;
  Message *local_b0;
  uint32 *local_a8;
  LogMessage local_a0;
  LogMessage local_68;
  
  ppFVar16 = (output->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  if ((output->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar16) {
    (output->
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppFVar16;
  }
  if ((this->schema_).default_instance_ != message) {
    this_00 = &this->schema_;
    local_b8 = this_00;
    if ((this->schema_).has_bits_offset_ == -1) {
      local_c0 = 0;
    }
    else {
      if ((this->schema_).has_bits_offset_ == -1) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x776);
        pLVar13 = LogMessage::operator<<(&local_68,"CHECK failed: schema_.HasHasbits(): ");
        LogFinisher::operator=((LogFinisher *)&local_a0,pLVar13);
        LogMessage::~LogMessage(&local_68);
      }
      uVar11 = ReflectionSchema::HasBitsOffset(this_00);
      local_c0 = (long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar11;
    }
    local_a8 = (this->schema_).has_bit_indices_;
    uVar2 = (this->schema_).oneof_case_offset_;
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::reserve(output,(long)*(int *)(this->descriptor_ + 0x2c));
    message_00 = message;
    if (-1 < this->last_non_weak_field_index_) {
      lVar15 = -1;
      lVar17 = 0;
      local_b0 = message;
      do {
        lVar5 = *(long *)(this->descriptor_ + 0x30);
        local_d0 = (FieldDescriptor *)(lVar5 + lVar17);
        if (*(int *)(lVar5 + 0x4c + lVar17) == 3) {
          iVar12 = FieldSize(this,message_00,local_d0);
          if (0 < iVar12) goto LAB_0031a124;
        }
        else {
          lVar6 = *(long *)(lVar5 + 0x60 + lVar17);
          if (lVar6 == 0) {
            if (local_c0 == 0) {
              bVar10 = HasBit(this,message_00,local_d0);
              if (bVar10) goto LAB_0031a124;
            }
            else {
              uVar3 = local_a8[lVar15 + 1];
              if (uVar3 == 0xffffffff) {
                LogMessage::LogMessage
                          (&local_a0,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                           ,1000);
                pLVar13 = LogMessage::operator<<
                                    (&local_a0,"CHECK failed: (has_bit_index) != (~0u): ");
                LogFinisher::operator=(&local_c1,pLVar13);
                LogMessage::~LogMessage(&local_a0);
              }
              message_00 = local_b0;
              if ((*(uint *)(local_c0 + (ulong)(uVar3 >> 5) * 4) >> (uVar3 & 0x1f) & 1) != 0) {
LAB_0031a124:
                __position._M_current =
                     (output->
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (output->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0031a177;
                *__position._M_current = local_d0;
                goto LAB_0031a170;
              }
            }
          }
          else if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                           (long)((int)((ulong)(lVar6 - *(long *)(*(long *)(lVar6 + 0x10) + 0x40))
                                       >> 4) * -0x55555555) * 4 + (ulong)uVar2) ==
                   *(int *)(lVar5 + 0x38 + lVar17)) {
            __position._M_current =
                 (output->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (output->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_0031a177:
              std::
              vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                        ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                          *)output,__position,&local_d0);
            }
            else {
              *__position._M_current = local_d0;
LAB_0031a170:
              pppFVar1 = &(output->
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              *pppFVar1 = *pppFVar1 + 1;
            }
          }
        }
        lVar15 = lVar15 + 1;
        lVar17 = lVar17 + 0xa8;
      } while (lVar15 < this->last_non_weak_field_index_);
    }
    if ((this->schema_).extensions_offset_ != -1) {
      uVar11 = ReflectionSchema::GetExtensionSetOffset(local_b8);
      ExtensionSet::AppendToList
                ((ExtensionSet *)
                 ((long)&(message_00->super_MessageLite)._vptr_MessageLite + (ulong)uVar11),
                 this->descriptor_,this->descriptor_pool_,output);
    }
    ppFVar16 = (output->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    ppFVar7 = (output->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar16 != ppFVar7) {
      uVar14 = (long)ppFVar7 - (long)ppFVar16 >> 3;
      lVar15 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::(anonymous_namespace)::FieldNumberSorter>>
                (ppFVar16,ppFVar7,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppFVar7 - (long)ppFVar16 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::(anonymous_namespace)::FieldNumberSorter>>
                  (ppFVar16,ppFVar7);
      }
      else {
        ppFVar18 = ppFVar16 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::(anonymous_namespace)::FieldNumberSorter>>
                  (ppFVar16,ppFVar18);
        for (; ppFVar18 != ppFVar7; ppFVar18 = ppFVar18 + 1) {
          pFVar8 = ppFVar18[-1];
          pFVar9 = *ppFVar18;
          iVar4 = *(int *)(pFVar9 + 0x38);
          iVar12 = *(int *)(pFVar8 + 0x38);
          ppFVar16 = ppFVar18;
          while (iVar4 < iVar12) {
            *ppFVar16 = pFVar8;
            pFVar8 = ppFVar16[-2];
            ppFVar16 = ppFVar16 + -1;
            iVar12 = *(int *)(pFVar8 + 0x38);
          }
          *ppFVar16 = pFVar9;
        }
      }
    }
  }
  return;
}

Assistant:

void GeneratedMessageReflection::ListFields(
    const Message& message,
    std::vector<const FieldDescriptor*>* output) const {
  output->clear();

  // Optimization:  The default instance never has any fields set.
  if (schema_.IsDefaultInstance(message)) return;

  // Optimization: Avoid calling GetHasBits() and HasOneofField() many times
  // within the field loop.  We allow this violation of ReflectionSchema
  // encapsulation because this function takes a noticable about of CPU
  // fleetwide and properly allowing this optimization through public interfaces
  // seems more trouble than it is worth.
  const uint32* const has_bits =
      schema_.HasHasbits() ? GetHasBits(message) : NULL;
  const uint32* const has_bits_indices = schema_.has_bit_indices_;
  const uint32* const oneof_case_array =
      &GetConstRefAtOffset<uint32>(message, schema_.oneof_case_offset_);
  output->reserve(descriptor_->field_count());
  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      if (FieldSize(message, field) > 0) {
        output->push_back(field);
      }
    } else {
      const OneofDescriptor* containing_oneof = field->containing_oneof();
      if (containing_oneof) {
        // Equivalent to: HasOneofField(message, field)
        if (oneof_case_array[containing_oneof->index()] == field->number()) {
          output->push_back(field);
        }
      } else if (has_bits) {
        // Equivalent to: HasBit(message, field)
        if (IsIndexInHasBitSet(has_bits, has_bits_indices[i])) {
          output->push_back(field);
        }
      } else if (HasBit(message, field)) {  // Fall back on proto3-style HasBit.
        output->push_back(field);
      }
    }
  }
  if (schema_.HasExtensionSet()) {
    GetExtensionSet(message).AppendToList(descriptor_, descriptor_pool_,
                                          output);
  }

  // ListFields() must sort output by field number.
  std::sort(output->begin(), output->end(), FieldNumberSorter());
}